

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindProgramCommand.cxx
# Opt level: O0

bool __thiscall
cmFindProgramHelper::CheckDirectoryForName(cmFindProgramHelper *this,string *path,string *name)

{
  iterator str1;
  bool bVar1;
  ulong uVar2;
  char *str2;
  reference pbVar3;
  string local_58;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_38;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  iterator ext;
  string *name_local;
  string *path_local;
  cmFindProgramHelper *this_local;
  
  ext._M_current = name;
  local_30._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&this->Extensions);
  do {
    local_38._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->Extensions);
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_38);
    if (!bVar1) {
      return false;
    }
    std::__cxx11::string::operator=((string *)&this->TestPath,(string *)path);
    std::__cxx11::string::operator+=((string *)&this->TestPath,(string *)ext._M_current);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator->(&local_30);
    uVar2 = std::__cxx11::string::empty();
    str1 = ext;
    if ((uVar2 & 1) == 0) {
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->(&local_30);
      str2 = (char *)std::__cxx11::string::c_str();
      bVar1 = cmsys::SystemTools::StringEndsWith(str1._M_current,str2);
      if (!bVar1) goto LAB_006d0cfc;
    }
    else {
LAB_006d0cfc:
      pbVar3 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_30);
      std::__cxx11::string::operator+=((string *)&this->TestPath,(string *)pbVar3);
      bVar1 = cmsys::SystemTools::FileExists(&this->TestPath,true);
      if (bVar1) {
        cmsys::SystemTools::CollapseFullPath(&local_58,&this->TestPath);
        std::__cxx11::string::operator=((string *)&this->BestPath,(string *)&local_58);
        std::__cxx11::string::~string((string *)&local_58);
        return true;
      }
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_30);
  } while( true );
}

Assistant:

bool CheckDirectoryForName(std::string const& path, std::string const& name)
  {
    for (std::vector<std::string>::iterator ext = this->Extensions.begin();
         ext != this->Extensions.end(); ++ext) {
      this->TestPath = path;
      this->TestPath += name;
      if (!ext->empty() && cmSystemTools::StringEndsWith(name, ext->c_str())) {
        continue;
      }
      this->TestPath += *ext;
      if (cmSystemTools::FileExists(this->TestPath, true)) {
        this->BestPath = cmSystemTools::CollapseFullPath(this->TestPath);
        return true;
      }
    }
    return false;
  }